

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

Logger * __thiscall higan::Logger::operator<<(Logger *this,Fmt *fmt)

{
  char *str;
  Logger *pLVar1;
  Fmt *fmt_local;
  Logger *this_local;
  
  str = Fmt::CStr(fmt);
  pLVar1 = operator<<(this,str);
  return pLVar1;
}

Assistant:

Logger& Logger::operator<<(const Fmt& fmt)
{
	return *this << fmt.CStr();
}